

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O0

void Omega_h::filter_coarsen_candidates
               (LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals)

{
  Read<double> local_130;
  Read<int> local_120;
  Write<double> local_110;
  Read<double> local_100;
  Read<signed_char> local_f0;
  Read<int> local_e0;
  Write<signed_char> local_d0;
  Read<signed_char> local_c0;
  Read<int> local_b0;
  Read<int> local_a0;
  Write<int> local_90;
  Read<int> local_80;
  Read<signed_char> local_70;
  undefined1 local_60 [8];
  LOs new2old;
  Read<signed_char> local_40;
  undefined1 local_30 [8];
  Bytes keep;
  Reals *cand_quals_local;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  
  keep.write_.shared_alloc_.direct_ptr = cand_quals;
  Read<signed_char>::Read(&local_40,cand_codes);
  each_neq_to<signed_char>((Omega_h *)local_30,&local_40,'\0');
  Read<signed_char>::~Read(&local_40);
  Read<signed_char>::Read(&local_70,(Read<signed_char> *)local_30);
  collect_marked((Omega_h *)local_60,&local_70);
  Read<signed_char>::~Read(&local_70);
  Read<int>::Read(&local_a0,(Read<int> *)local_60);
  Read<int>::Read(&local_b0,cands2edges);
  unmap<int>((Omega_h *)&local_90,&local_a0,&local_b0,1);
  Read<int>::Read(&local_80,&local_90);
  Read<int>::operator=(cands2edges,&local_80);
  Read<int>::~Read(&local_80);
  Write<int>::~Write(&local_90);
  Read<int>::~Read(&local_b0);
  Read<int>::~Read(&local_a0);
  Read<int>::Read(&local_e0,(Read<int> *)local_60);
  Read<signed_char>::Read(&local_f0,cand_codes);
  unmap<signed_char>((Omega_h *)&local_d0,&local_e0,&local_f0,1);
  Read<signed_char>::Read(&local_c0,&local_d0);
  Read<signed_char>::operator=(cand_codes,&local_c0);
  Read<signed_char>::~Read(&local_c0);
  Write<signed_char>::~Write(&local_d0);
  Read<signed_char>::~Read(&local_f0);
  Read<int>::~Read(&local_e0);
  if (keep.write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<int>::Read(&local_120,(Read<int> *)local_60);
    Read<double>::Read(&local_130,(Read<double> *)keep.write_.shared_alloc_.direct_ptr);
    unmap<double>((Omega_h *)&local_110,&local_120,(Read<signed_char> *)&local_130,2);
    Read<double>::Read(&local_100,&local_110);
    Read<double>::operator=((Read<double> *)keep.write_.shared_alloc_.direct_ptr,&local_100);
    Read<double>::~Read(&local_100);
    Write<double>::~Write(&local_110);
    Read<double>::~Read(&local_130);
    Read<int>::~Read(&local_120);
  }
  Read<int>::~Read((Read<int> *)local_60);
  Read<signed_char>::~Read((Read<signed_char> *)local_30);
  return;
}

Assistant:

static void filter_coarsen_candidates(
    LOs* cands2edges, Read<I8>* cand_codes, Reals* cand_quals = nullptr) {
  auto keep = each_neq_to(*cand_codes, I8(DONT_COLLAPSE));
  auto new2old = collect_marked(keep);
  *cands2edges = unmap(new2old, *cands2edges, 1);
  *cand_codes = unmap(new2old, *cand_codes, 1);
  if (cand_quals) *cand_quals = unmap(new2old, *cand_quals, 2);
}